

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_maketables.c
# Opt level: O0

uint8_t * pcre2_maketables_8(pcre2_general_context_8 *gcontext)

{
  byte bVar1;
  int iVar2;
  ushort **ppuVar3;
  char *pcVar4;
  long lVar5;
  char cVar6;
  undefined1 local_44;
  pcre2_general_context_8 *local_40;
  _func_void_void_ptr_void_ptr **pp_Stack_30;
  int x;
  uint8_t *p;
  int i;
  uint8_t *yield;
  pcre2_general_context_8 *gcontext_local;
  
  if (gcontext == (pcre2_general_context_8 *)0x0) {
    local_40 = (pcre2_general_context_8 *)malloc(0x440);
  }
  else {
    local_40 = (pcre2_general_context_8 *)
               (*(gcontext->memctl).malloc)(0x440,(gcontext->memctl).memory_data);
  }
  if (local_40 == (pcre2_general_context_8 *)0x0) {
    gcontext_local = (pcre2_general_context_8 *)0x0;
  }
  else {
    pp_Stack_30 = (_func_void_void_ptr_void_ptr **)local_40;
    for (p._4_4_ = 0; p._4_4_ < 0x100; p._4_4_ = p._4_4_ + 1) {
      iVar2 = tolower(p._4_4_);
      *(char *)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc = (char)iVar2;
      pp_Stack_30 = (_func_void_void_ptr_void_ptr **)
                    ((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + 1);
    }
    for (p._4_4_ = 0; p._4_4_ < 0x100; p._4_4_ = p._4_4_ + 1) {
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[p._4_4_] & 0x200) == 0) {
        iVar2 = tolower(p._4_4_);
        local_44 = (undefined1)iVar2;
      }
      else {
        iVar2 = toupper(p._4_4_);
        local_44 = (undefined1)iVar2;
      }
      *(undefined1 *)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc = local_44;
      pp_Stack_30 = (_func_void_void_ptr_void_ptr **)
                    ((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + 1);
    }
    memset(pp_Stack_30,0,0x140);
    for (p._4_4_ = 0; p._4_4_ < 0x100; p._4_4_ = p._4_4_ + 1) {
      ppuVar3 = __ctype_b_loc();
      bVar1 = (byte)p._4_4_;
      if (((*ppuVar3)[p._4_4_] & 0x800) != 0) {
        lVar5 = (long)(p._4_4_ / 8 + 0x40);
        *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) =
             *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) |
             (byte)(1 << (bVar1 & 7));
      }
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[p._4_4_] & 0x100) != 0) {
        lVar5 = (long)(p._4_4_ / 8 + 0x60);
        *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) =
             *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) |
             (byte)(1 << (bVar1 & 7));
      }
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[p._4_4_] & 0x200) != 0) {
        lVar5 = (long)(p._4_4_ / 8 + 0x80);
        *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) =
             *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) |
             (byte)(1 << (bVar1 & 7));
      }
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[p._4_4_] & 8) != 0) {
        lVar5 = (long)(p._4_4_ / 8 + 0xa0);
        *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) =
             *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) |
             (byte)(1 << (bVar1 & 7));
      }
      if (p._4_4_ == 0x5f) {
        *(byte *)((long)&(((pcre2_general_context_8 *)((long)pp_Stack_30 + 0xa8))->memctl).malloc +
                 3) = *(byte *)((long)&(((pcre2_general_context_8 *)((long)pp_Stack_30 + 0xa8))->
                                       memctl).malloc + 3) | (byte)(1 << (bVar1 & 7));
      }
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[p._4_4_] & 0x2000) != 0) {
        *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc +
                 (long)(p._4_4_ / 8)) =
             *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc +
                      (long)(p._4_4_ / 8)) | (byte)(1 << (bVar1 & 7));
      }
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[p._4_4_] & 0x1000) != 0) {
        lVar5 = (long)(p._4_4_ / 8 + 0x20);
        *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) =
             *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) |
             (byte)(1 << (bVar1 & 7));
      }
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[p._4_4_] & 0x8000) != 0) {
        lVar5 = (long)(p._4_4_ / 8 + 0xc0);
        *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) =
             *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) |
             (byte)(1 << (bVar1 & 7));
      }
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[p._4_4_] & 0x4000) != 0) {
        lVar5 = (long)(p._4_4_ / 8 + 0xe0);
        *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) =
             *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) |
             (byte)(1 << (bVar1 & 7));
      }
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[p._4_4_] & 4) != 0) {
        lVar5 = (long)(p._4_4_ / 8 + 0x100);
        *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) =
             *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) |
             (byte)(1 << (bVar1 & 7));
      }
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[p._4_4_] & 2) != 0) {
        lVar5 = (long)(p._4_4_ / 8 + 0x120);
        *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) =
             *(byte *)((long)&(((pcre2_general_context_8 *)pp_Stack_30)->memctl).malloc + lVar5) |
             (byte)(1 << (bVar1 & 7));
      }
    }
    pp_Stack_30 = &(((pcre2_general_context_8 *)((long)pp_Stack_30 + 0x138))->memctl).free;
    for (p._4_4_ = 0; p._4_4_ < 0x100; p._4_4_ = p._4_4_ + 1) {
      ppuVar3 = __ctype_b_loc();
      cVar6 = ((*ppuVar3)[p._4_4_] & 0x2000) != 0;
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[p._4_4_] & 0x400) != 0) {
        cVar6 = cVar6 + '\x02';
      }
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[p._4_4_] & 0x800) != 0) {
        cVar6 = cVar6 + '\x04';
      }
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[p._4_4_] & 0x1000) != 0) {
        cVar6 = cVar6 + '\b';
      }
      ppuVar3 = __ctype_b_loc();
      if ((((*ppuVar3)[p._4_4_] & 8) != 0) || (p._4_4_ == 0x5f)) {
        cVar6 = cVar6 + '\x10';
      }
      pcVar4 = strchr("\\*+?{^.$|()[",p._4_4_);
      if (pcVar4 != (char *)0x0) {
        cVar6 = cVar6 + -0x80;
      }
      *(char *)pp_Stack_30 = cVar6;
      pp_Stack_30 = (_func_void_void_ptr_void_ptr **)((long)pp_Stack_30 + 1);
    }
    gcontext_local = local_40;
  }
  return (uint8_t *)gcontext_local;
}

Assistant:

PCRE2_EXP_DEFN const uint8_t * PCRE2_CALL_CONVENTION
pcre2_maketables(pcre2_general_context *gcontext)
{
uint8_t *yield = (uint8_t *)((gcontext != NULL)?
  gcontext->memctl.malloc(tables_length, gcontext->memctl.memory_data) :
  malloc(tables_length));
#endif  /* DFTABLES */

int i;
uint8_t *p;

if (yield == NULL) return NULL;
p = yield;

/* First comes the lower casing table */

for (i = 0; i < 256; i++) *p++ = tolower(i);

/* Next the case-flipping table */

for (i = 0; i < 256; i++) *p++ = islower(i)? toupper(i) : tolower(i);

/* Then the character class tables. Don't try to be clever and save effort on
exclusive ones - in some locales things may be different.

Note that the table for "space" includes everything "isspace" gives, including
VT in the default locale. This makes it work for the POSIX class [:space:].
From release 8.34 is is also correct for Perl space, because Perl added VT at
release 5.18.

Note also that it is possible for a character to be alnum or alpha without
being lower or upper, such as "male and female ordinals" (\xAA and \xBA) in the
fr_FR locale (at least under Debian Linux's locales as of 12/2005). So we must
test for alnum specially. */

memset(p, 0, cbit_length);
for (i = 0; i < 256; i++)
  {
  if (isdigit(i)) p[cbit_digit  + i/8] |= 1 << (i&7);
  if (isupper(i)) p[cbit_upper  + i/8] |= 1 << (i&7);
  if (islower(i)) p[cbit_lower  + i/8] |= 1 << (i&7);
  if (isalnum(i)) p[cbit_word   + i/8] |= 1 << (i&7);
  if (i == '_')   p[cbit_word   + i/8] |= 1 << (i&7);
  if (isspace(i)) p[cbit_space  + i/8] |= 1 << (i&7);
  if (isxdigit(i))p[cbit_xdigit + i/8] |= 1 << (i&7);
  if (isgraph(i)) p[cbit_graph  + i/8] |= 1 << (i&7);
  if (isprint(i)) p[cbit_print  + i/8] |= 1 << (i&7);
  if (ispunct(i)) p[cbit_punct  + i/8] |= 1 << (i&7);
  if (iscntrl(i)) p[cbit_cntrl  + i/8] |= 1 << (i&7);
  }
p += cbit_length;

/* Finally, the character type table. In this, we used to exclude VT from the
white space chars, because Perl didn't recognize it as such for \s and for
comments within regexes. However, Perl changed at release 5.18, so PCRE changed
at release 8.34. */

for (i = 0; i < 256; i++)
  {
  int x = 0;
  if (isspace(i)) x += ctype_space;
  if (isalpha(i)) x += ctype_letter;
  if (isdigit(i)) x += ctype_digit;
  if (isxdigit(i)) x += ctype_xdigit;
  if (isalnum(i) || i == '_') x += ctype_word;

  /* Note: strchr includes the terminating zero in the characters it considers.
  In this instance, that is ok because we want binary zero to be flagged as a
  meta-character, which in this sense is any character that terminates a run
  of data characters. */

  if (strchr("\\*+?{^.$|()[", i) != 0) x += ctype_meta;
  *p++ = x;
  }

return yield;
}